

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O2

uint32_t __thiscall
slang::IntervalMapDetails::
NodeImpl<unsigned_long,_slang::IntervalMapDetails::LeafNode<unsigned_long,_const_slang::ast::ValueDriver_*,_8U,_true>_>
::find(NodeImpl<unsigned_long,_slang::IntervalMapDetails::LeafNode<unsigned_long,_const_slang::ast::ValueDriver_*,_8U,_true>_>
       *this,uint32_t size,interval<unsigned_long> *key)

{
  uint32_t uVar1;
  uint uVar2;
  
  uVar2 = 0;
  while ((uVar1 = size, size != uVar2 &&
         (uVar1 = uVar2, *(ulong *)(this + (ulong)uVar2 * 0x10) < key->left))) {
    uVar2 = uVar2 + 1;
  }
  return uVar1;
}

Assistant:

uint32_t find(uint32_t size, const interval<TKey>& key) const {
        SLANG_ASSERT(size <= TDerived::Capacity);
        auto& self = *static_cast<const TDerived*>(this);
        uint32_t i = 0;
        while (i != size && self.keyAt(i).left < key.left)
            i++;
        return i;
    }